

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c++
# Opt level: O0

void capnp::compiler::anon_unknown_0::buildTokenSequenceList
               (Builder builder,Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *items)

{
  size_t sVar1;
  Orphan<capnp::compiler::Token> *pOVar2;
  uint local_4c;
  undefined1 local_48 [4];
  uint j;
  Builder itemBuilder;
  Array<capnp::Orphan<capnp::compiler::Token>_> *item;
  uint i;
  Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_> *items_local;
  
  item._4_4_ = 0;
  while( true ) {
    sVar1 = kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::size(items);
    if (sVar1 <= item._4_4_) break;
    itemBuilder.builder._32_8_ =
         kj::Array<kj::Array<capnp::Orphan<capnp::compiler::Token>_>_>::operator[]
                   (items,(ulong)item._4_4_);
    kj::Array<capnp::Orphan<capnp::compiler::Token>_>::size
              ((Array<capnp::Orphan<capnp::compiler::Token>_> *)itemBuilder.builder._32_8_);
    List<capnp::List<capnp::compiler::Token,_(capnp::Kind)3>,_(capnp::Kind)6>::Builder::init
              ((Builder *)local_48,(EVP_PKEY_CTX *)&builder);
    local_4c = 0;
    while( true ) {
      sVar1 = kj::Array<capnp::Orphan<capnp::compiler::Token>_>::size
                        ((Array<capnp::Orphan<capnp::compiler::Token>_> *)itemBuilder.builder._32_8_
                        );
      if (sVar1 <= local_4c) break;
      pOVar2 = kj::Array<capnp::Orphan<capnp::compiler::Token>_>::operator[]
                         ((Array<capnp::Orphan<capnp::compiler::Token>_> *)
                          itemBuilder.builder._32_8_,(ulong)local_4c);
      pOVar2 = kj::mv<capnp::Orphan<capnp::compiler::Token>>(pOVar2);
      List<capnp::compiler::Token,_(capnp::Kind)3>::Builder::adoptWithCaveats
                ((Builder *)local_48,local_4c,pOVar2);
      local_4c = local_4c + 1;
    }
    item._4_4_ = item._4_4_ + 1;
  }
  return;
}

Assistant:

void buildTokenSequenceList(List<List<Token>>::Builder builder,
                            kj::Array<kj::Array<Orphan<Token>>>&& items) {
  for (uint i = 0; i < items.size(); i++) {
    auto& item = items[i];
    auto itemBuilder = builder.init(i, item.size());
    for (uint j = 0; j < item.size(); j++) {
      itemBuilder.adoptWithCaveats(j, kj::mv(item[j]));
    }
  }
}